

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Algorithm_Base.cpp
# Opt level: O1

void __thiscall OSTEI_VRR_Algorithm_Base::Create(OSTEI_VRR_Algorithm_Base *this,QuartetSet *q)

{
  _Rb_tree_header *p_Var1;
  IdxOrder idx_order_00;
  _Base_ptr p_Var2;
  int *__buffer;
  QuartetSet *__range1;
  pair<int_*,_long> pVar3;
  IdxOrder idx_order;
  undefined1 local_b8 [16];
  undefined1 *local_a8;
  undefined8 local_a0;
  undefined1 local_98 [8];
  undefined8 uStack_90;
  undefined1 *local_88;
  undefined8 local_80;
  undefined1 local_78 [8];
  undefined8 uStack_70;
  QAM local_68;
  
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
  local_a8 = local_98;
  local_b8 = (undefined1  [16])0x0;
  if (local_88 == local_78) {
    uStack_90 = uStack_70;
  }
  else {
    local_a8 = local_88;
  }
  local_a0 = local_80;
  local_80 = 0;
  local_78[0] = 0;
  p_Var2 = (q->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(q->_M_t)._M_impl.super__Rb_tree_header;
  local_88 = local_78;
  if ((_Rb_tree_header *)p_Var2 != p_Var1) {
    do {
      Quartet::amlist(&local_68,(Quartet *)(p_Var2 + 1));
      local_b8._4_4_ =
           ~-(uint)(local_68.qam._M_elems[1] < (int)local_b8._4_4_) & local_68.qam._M_elems[1] |
           local_b8._4_4_ & -(uint)(local_68.qam._M_elems[1] < (int)local_b8._4_4_);
      local_b8._0_4_ =
           ~-(uint)(local_68.qam._M_elems[0] < (int)local_b8._0_4_) & local_68.qam._M_elems[0] |
           local_b8._0_4_ & -(uint)(local_68.qam._M_elems[0] < (int)local_b8._0_4_);
      local_b8._8_4_ =
           ~-(uint)(local_68.qam._M_elems[2] < (int)local_b8._8_4_) & local_68.qam._M_elems[2] |
           local_b8._8_4_ & -(uint)(local_68.qam._M_elems[2] < (int)local_b8._8_4_);
      local_b8._12_4_ =
           ~-(uint)(local_68.qam._M_elems[3] < (int)local_b8._12_4_) & local_68.qam._M_elems[3] |
           local_b8._12_4_ & -(uint)(local_68.qam._M_elems[3] < (int)local_b8._12_4_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68.tag._M_dataplus._M_p != &local_68.tag.field_2) {
        operator_delete(local_68.tag._M_dataplus._M_p);
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var1);
  }
  local_68.qam._M_elems[0] = 3;
  local_68.qam._M_elems[1] = 2;
  local_68.qam._M_elems[2] = 1;
  local_68.qam._M_elems[3] = 0;
  pVar3 = std::get_temporary_buffer<int>(2);
  __buffer = pVar3.first;
  if (__buffer == (int *)0x0) {
    std::
    __insertion_sort<int*,__gnu_cxx::__ops::_Iter_comp_iter<OSTEI_VRR_Algorithm_Base::Create(std::set<Quartet,std::less<Quartet>,std::allocator<Quartet>>const&)::__0>>
              ((int *)&local_68,(int *)&local_68.tag,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simint_chem[P]simint_generator_generator_ostei_OSTEI_VRR_Algorithm_Base_cpp:466:22)>
                )local_b8);
  }
  else {
    std::
    __stable_sort_adaptive<int*,int*,long,__gnu_cxx::__ops::_Iter_comp_iter<OSTEI_VRR_Algorithm_Base::Create(std::set<Quartet,std::less<Quartet>,std::allocator<Quartet>>const&)::__0>>
              ((int *)&local_68,(int *)&local_68.tag,__buffer,pVar3.second,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simint_chem[P]simint_generator_generator_ostei_OSTEI_VRR_Algorithm_Base_cpp:466:22)>
                )local_b8);
  }
  operator_delete(__buffer);
  idx_order_00._M_elems[1] = local_68.qam._M_elems[1];
  idx_order_00._M_elems[0] = local_68.qam._M_elems[0];
  idx_order_00._M_elems[2] = local_68.qam._M_elems[2];
  idx_order_00._M_elems[3] = local_68.qam._M_elems[3];
  Create_WithOrder(this,q,idx_order_00);
  if (local_a8 != local_98) {
    operator_delete(local_a8);
  }
  return;
}

Assistant:

void OSTEI_VRR_Algorithm_Base::Create(const QuartetSet & q)
{
    // Find where the lowest AM is first. This is our initial RR
    QAM qam_max{0,0,0,0};
    for(const Quartet & iq : q)
    {
        QAM aml = iq.amlist();
        for(int i = 0; i < 4; i++)
            qam_max[i] = std::max(qam_max[i], aml[i]);
    }


    // reversed, so we end up with a more "traditional" order
    // (ie, form dsss, then dsps).
    IdxOrder idx_order{3, 2, 1, 0}; 

    std::stable_sort(idx_order.begin(), idx_order.end(),
                     [ & qam_max ] ( int i, int j ) { return qam_max[i] < qam_max[j]; });

    Create_WithOrder(q, idx_order);
}